

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O2

void __thiscall serialize_tests::varints_bitpatterns::test_method(varints_bitpatterns *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  string *psVar2;
  long in_FS_OFFSET;
  const_string file;
  Span<const_unsigned_char> s;
  const_string file_00;
  Span<const_unsigned_char> s_00;
  const_string file_01;
  Span<const_unsigned_char> s_01;
  const_string file_02;
  Span<const_unsigned_char> s_02;
  const_string file_03;
  Span<const_unsigned_char> s_03;
  const_string file_04;
  Span<const_unsigned_char> s_04;
  const_string file_05;
  Span<const_unsigned_char> s_05;
  const_string file_06;
  Span<const_unsigned_char> s_06;
  const_string file_07;
  Span<const_unsigned_char> s_07;
  const_string file_08;
  Span<const_unsigned_char> s_08;
  const_string file_09;
  Span<const_unsigned_char> s_09;
  const_string file_10;
  Span<const_unsigned_char> s_10;
  const_string file_11;
  Span<const_unsigned_char> s_11;
  const_string file_12;
  Span<const_unsigned_char> s_12;
  const_string file_13;
  Span<const_unsigned_char> s_13;
  const_string file_14;
  Span<const_unsigned_char> s_14;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_long_long_&> local_b8;
  undefined1 local_b0;
  undefined1 *local_a8;
  char *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  DataStream local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8.m_object = (unsigned_long_long *)&local_58;
  local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffff00000000;
  local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.m_read_pos = 0;
  local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Wrapper<VarIntFormatter<(VarIntMode)1>,_int_&>::Serialize<DataStream>
            ((Wrapper<VarIntFormatter<(VarIntMode)1>,_int_&> *)&local_b8,&local_78);
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x8b;
  file.m_begin = (iterator)&local_88;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_98,msg);
  local_b0 = 0;
  local_b8.m_object = (unsigned_long_long *)&PTR__lazy_ostream_011480b0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = "";
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_c0 = "";
  s.m_data = local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start + local_78.m_read_pos;
  s.m_size = (long)local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)s.m_data;
  HexStr_abi_cxx11_(&local_58,s);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
            (&local_b8,&local_c8,0x8b,1,2,psVar2,"HexStr(ss)","00","\"00\"");
  std::__cxx11::string::~string((string *)&local_58);
  if (local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_78.m_read_pos = 0;
  local_58._M_dataplus._M_p._0_4_ = 0x7f;
  local_b8.m_object = (unsigned_long_long *)&local_58;
  Wrapper<VarIntFormatter<(VarIntMode)1>,_int_&>::Serialize<DataStream>
            ((Wrapper<VarIntFormatter<(VarIntMode)1>,_int_&> *)&local_b8,&local_78);
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x8c;
  file_00.m_begin = (iterator)&local_d8;
  msg_00.m_end = (iterator)psVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_e8,msg_00
            );
  local_b0 = 0;
  local_b8.m_object = (unsigned_long_long *)&PTR__lazy_ostream_011480b0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = "";
  local_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_f0 = "";
  s_00.m_data = local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_start + local_78.m_read_pos;
  s_00.m_size = (long)local_78.vch.
                      super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)s_00.m_data;
  HexStr_abi_cxx11_(&local_58,s_00);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
            (&local_b8,&local_f8,0x8c,1,2,psVar2,"HexStr(ss)","7f","\"7f\"");
  std::__cxx11::string::~string((string *)&local_58);
  if (local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_78.m_read_pos = 0;
  local_58._M_dataplus._M_p._0_1_ = 0x7f;
  local_b8.m_object = (unsigned_long_long *)&local_58;
  Wrapper<VarIntFormatter<(VarIntMode)1>,_signed_char_&>::Serialize<DataStream>
            ((Wrapper<VarIntFormatter<(VarIntMode)1>,_signed_char_&> *)&local_b8,&local_78);
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x8d;
  file_01.m_begin = (iterator)&local_108;
  msg_01.m_end = (iterator)psVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_118,
             msg_01);
  local_b0 = 0;
  local_b8.m_object = (unsigned_long_long *)&PTR__lazy_ostream_011480b0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = "";
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_120 = "";
  s_01.m_data = local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_start + local_78.m_read_pos;
  s_01.m_size = (long)local_78.vch.
                      super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)s_01.m_data;
  HexStr_abi_cxx11_(&local_58,s_01);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
            (&local_b8,&local_128,0x8d,1,2,psVar2,"HexStr(ss)","7f","\"7f\"");
  std::__cxx11::string::~string((string *)&local_58);
  if (local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_78.m_read_pos = 0;
  local_58._M_dataplus._M_p._0_4_ = 0x80;
  local_b8.m_object = (unsigned_long_long *)&local_58;
  Wrapper<VarIntFormatter<(VarIntMode)1>,_int_&>::Serialize<DataStream>
            ((Wrapper<VarIntFormatter<(VarIntMode)1>,_int_&> *)&local_b8,&local_78);
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x8e;
  file_02.m_begin = (iterator)&local_138;
  msg_02.m_end = (iterator)psVar2;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_148,
             msg_02);
  local_b0 = 0;
  local_b8.m_object = (unsigned_long_long *)&PTR__lazy_ostream_011480b0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = "";
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_150 = "";
  s_02.m_data = local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_start + local_78.m_read_pos;
  s_02.m_size = (long)local_78.vch.
                      super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)s_02.m_data;
  HexStr_abi_cxx11_(&local_58,s_02);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (&local_b8,&local_158,0x8e,1,2,psVar2,"HexStr(ss)","8000","\"8000\"");
  std::__cxx11::string::~string((string *)&local_58);
  if (local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_78.m_read_pos = 0;
  local_58._M_dataplus._M_p._0_1_ = 0x80;
  local_b8.m_object = (unsigned_long_long *)&local_58;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_char_&>::Serialize<DataStream>
            ((Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_char_&> *)&local_b8,&local_78);
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x8f;
  file_03.m_begin = (iterator)&local_168;
  msg_03.m_end = (iterator)psVar2;
  msg_03.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_178,
             msg_03);
  local_b0 = 0;
  local_b8.m_object = (unsigned_long_long *)&PTR__lazy_ostream_011480b0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = "";
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_180 = "";
  s_03.m_data = local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_start + local_78.m_read_pos;
  s_03.m_size = (long)local_78.vch.
                      super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)s_03.m_data;
  HexStr_abi_cxx11_(&local_58,s_03);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (&local_b8,&local_188,0x8f,1,2,psVar2,"HexStr(ss)","8000","\"8000\"");
  std::__cxx11::string::~string((string *)&local_58);
  if (local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_78.m_read_pos = 0;
  local_58._M_dataplus._M_p._0_4_ = 0x1234;
  local_b8.m_object = (unsigned_long_long *)&local_58;
  Wrapper<VarIntFormatter<(VarIntMode)1>,_int_&>::Serialize<DataStream>
            ((Wrapper<VarIntFormatter<(VarIntMode)1>,_int_&> *)&local_b8,&local_78);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x90;
  file_04.m_begin = (iterator)&local_198;
  msg_04.m_end = (iterator)psVar2;
  msg_04.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1a8,
             msg_04);
  local_b0 = 0;
  local_b8.m_object = (unsigned_long_long *)&PTR__lazy_ostream_011480b0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = "";
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_1b0 = "";
  s_04.m_data = local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_start + local_78.m_read_pos;
  s_04.m_size = (long)local_78.vch.
                      super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)s_04.m_data;
  HexStr_abi_cxx11_(&local_58,s_04);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (&local_b8,&local_1b8,0x90,1,2,psVar2,"HexStr(ss)","a334","\"a334\"");
  std::__cxx11::string::~string((string *)&local_58);
  if (local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_78.m_read_pos = 0;
  local_58._M_dataplus._M_p._0_2_ = 0x1234;
  local_b8.m_object = (unsigned_long_long *)&local_58;
  Wrapper<VarIntFormatter<(VarIntMode)1>,_short_&>::Serialize<DataStream>
            ((Wrapper<VarIntFormatter<(VarIntMode)1>,_short_&> *)&local_b8,&local_78);
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x91;
  file_05.m_begin = (iterator)&local_1c8;
  msg_05.m_end = (iterator)psVar2;
  msg_05.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1d8,
             msg_05);
  local_b0 = 0;
  local_b8.m_object = (unsigned_long_long *)&PTR__lazy_ostream_011480b0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = "";
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_1e0 = "";
  s_05.m_data = local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_start + local_78.m_read_pos;
  s_05.m_size = (long)local_78.vch.
                      super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)s_05.m_data;
  HexStr_abi_cxx11_(&local_58,s_05);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (&local_b8,&local_1e8,0x91,1,2,psVar2,"HexStr(ss)","a334","\"a334\"");
  std::__cxx11::string::~string((string *)&local_58);
  if (local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_78.m_read_pos = 0;
  local_58._M_dataplus._M_p._0_4_ = 0xffff;
  local_b8.m_object = (unsigned_long_long *)&local_58;
  Wrapper<VarIntFormatter<(VarIntMode)1>,_int_&>::Serialize<DataStream>
            ((Wrapper<VarIntFormatter<(VarIntMode)1>,_int_&> *)&local_b8,&local_78);
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x92;
  file_06.m_begin = (iterator)&local_1f8;
  msg_06.m_end = (iterator)psVar2;
  msg_06.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_208,
             msg_06);
  local_b0 = 0;
  local_b8.m_object = (unsigned_long_long *)&PTR__lazy_ostream_011480b0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = "";
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_210 = "";
  s_06.m_data = local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_start + local_78.m_read_pos;
  s_06.m_size = (long)local_78.vch.
                      super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)s_06.m_data;
  HexStr_abi_cxx11_(&local_58,s_06);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
            (&local_b8,&local_218,0x92,1,2,psVar2,"HexStr(ss)","82fe7f","\"82fe7f\"");
  std::__cxx11::string::~string((string *)&local_58);
  if (local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_78.m_read_pos = 0;
  local_58._M_dataplus._M_p._0_2_ = 0xffff;
  local_b8.m_object = (unsigned_long_long *)&local_58;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_short_&>::Serialize<DataStream>
            ((Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_short_&> *)&local_b8,&local_78);
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x93;
  file_07.m_begin = (iterator)&local_228;
  msg_07.m_end = (iterator)psVar2;
  msg_07.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_238,
             msg_07);
  local_b0 = 0;
  local_b8.m_object = (unsigned_long_long *)&PTR__lazy_ostream_011480b0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = "";
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_240 = "";
  s_07.m_data = local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_start + local_78.m_read_pos;
  s_07.m_size = (long)local_78.vch.
                      super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)s_07.m_data;
  HexStr_abi_cxx11_(&local_58,s_07);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
            (&local_b8,&local_248,0x93,1,2,psVar2,"HexStr(ss)","82fe7f","\"82fe7f\"");
  std::__cxx11::string::~string((string *)&local_58);
  if (local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_78.m_read_pos = 0;
  local_58._M_dataplus._M_p._0_4_ = 0x123456;
  local_b8.m_object = (unsigned_long_long *)&local_58;
  Wrapper<VarIntFormatter<(VarIntMode)1>,_int_&>::Serialize<DataStream>
            ((Wrapper<VarIntFormatter<(VarIntMode)1>,_int_&> *)&local_b8,&local_78);
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x94;
  file_08.m_begin = (iterator)&local_258;
  msg_08.m_end = (iterator)psVar2;
  msg_08.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_268,
             msg_08);
  local_b0 = 0;
  local_b8.m_object = (unsigned_long_long *)&PTR__lazy_ostream_011480b0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = "";
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_270 = "";
  s_08.m_data = local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_start + local_78.m_read_pos;
  s_08.m_size = (long)local_78.vch.
                      super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)s_08.m_data;
  HexStr_abi_cxx11_(&local_58,s_08);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
            (&local_b8,&local_278,0x94,1,2,psVar2,"HexStr(ss)","c7e756","\"c7e756\"");
  std::__cxx11::string::~string((string *)&local_58);
  if (local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_78.m_read_pos = 0;
  local_58._M_dataplus._M_p._0_4_ = 0x123456;
  local_b8.m_object = (unsigned_long_long *)&local_58;
  Wrapper<VarIntFormatter<(VarIntMode)1>,_int_&>::Serialize<DataStream>
            ((Wrapper<VarIntFormatter<(VarIntMode)1>,_int_&> *)&local_b8,&local_78);
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x95;
  file_09.m_begin = (iterator)&local_288;
  msg_09.m_end = (iterator)psVar2;
  msg_09.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_298,
             msg_09);
  local_b0 = 0;
  local_b8.m_object = (unsigned_long_long *)&PTR__lazy_ostream_011480b0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = "";
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_2a0 = "";
  s_09.m_data = local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_start + local_78.m_read_pos;
  s_09.m_size = (long)local_78.vch.
                      super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)s_09.m_data;
  HexStr_abi_cxx11_(&local_58,s_09);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
            (&local_b8,&local_2a8,0x95,1,2,psVar2,"HexStr(ss)","c7e756","\"c7e756\"");
  std::__cxx11::string::~string((string *)&local_58);
  if (local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_78.m_read_pos = 0;
  local_58._M_dataplus._M_p._0_4_ = 0x80123456;
  local_b8.m_object = (unsigned_long_long *)&local_58;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&>::Serialize<DataStream>
            ((Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> *)&local_b8,&local_78);
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x96;
  file_10.m_begin = (iterator)&local_2b8;
  msg_10.m_end = (iterator)psVar2;
  msg_10.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2c8,
             msg_10);
  local_b0 = 0;
  local_b8.m_object = (unsigned_long_long *)&PTR__lazy_ostream_011480b0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = "";
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_2d0 = "";
  s_10.m_data = local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_start + local_78.m_read_pos;
  s_10.m_size = (long)local_78.vch.
                      super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)s_10.m_data;
  HexStr_abi_cxx11_(&local_58,s_10);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (&local_b8,&local_2d8,0x96,1,2,psVar2,"HexStr(ss)","86ffc7e756","\"86ffc7e756\"");
  std::__cxx11::string::~string((string *)&local_58);
  if (local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_78.m_read_pos = 0;
  local_58._M_dataplus._M_p._0_4_ = 0x80123456;
  local_b8.m_object = (unsigned_long_long *)&local_58;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&>::Serialize<DataStream>
            ((Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> *)&local_b8,&local_78);
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x97;
  file_11.m_begin = (iterator)&local_2e8;
  msg_11.m_end = (iterator)psVar2;
  msg_11.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_2f8,
             msg_11);
  local_b0 = 0;
  local_b8.m_object = (unsigned_long_long *)&PTR__lazy_ostream_011480b0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = "";
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_300 = "";
  s_11.m_data = local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_start + local_78.m_read_pos;
  s_11.m_size = (long)local_78.vch.
                      super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)s_11.m_data;
  HexStr_abi_cxx11_(&local_58,s_11);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (&local_b8,&local_308,0x97,1,2,psVar2,"HexStr(ss)","86ffc7e756","\"86ffc7e756\"");
  std::__cxx11::string::~string((string *)&local_58);
  if (local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_78.m_read_pos = 0;
  local_58._M_dataplus._M_p._0_4_ = 0xffffffff;
  local_b8.m_object = (unsigned_long_long *)&local_58;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&>::Serialize<DataStream>
            ((Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> *)&local_b8,&local_78);
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x98;
  file_12.m_begin = (iterator)&local_318;
  msg_12.m_end = (iterator)psVar2;
  msg_12.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_328,
             msg_12);
  local_b0 = 0;
  local_b8.m_object = (unsigned_long_long *)&PTR__lazy_ostream_011480b0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = "";
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_330 = "";
  s_12.m_data = local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_start + local_78.m_read_pos;
  s_12.m_size = (long)local_78.vch.
                      super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)s_12.m_data;
  HexStr_abi_cxx11_(&local_58,s_12);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (&local_b8,&local_338,0x98,1,2,psVar2,"HexStr(ss)","8efefefe7f","\"8efefefe7f\"");
  std::__cxx11::string::~string((string *)&local_58);
  if (local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_78.m_read_pos = 0;
  local_58._M_dataplus._M_p = (pointer)0x7fffffffffffffff;
  local_b8.m_object = (unsigned_long_long *)&local_58;
  Wrapper<VarIntFormatter<(VarIntMode)1>,_long_long_&>::Serialize<DataStream>
            ((Wrapper<VarIntFormatter<(VarIntMode)1>,_long_long_&> *)&local_b8,&local_78);
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x99;
  file_13.m_begin = (iterator)&local_348;
  msg_13.m_end = (iterator)psVar2;
  msg_13.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_358,
             msg_13);
  local_b0 = 0;
  local_b8.m_object = (unsigned_long_long *)&PTR__lazy_ostream_011480b0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = "";
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_360 = "";
  s_13.m_data = local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_start + local_78.m_read_pos;
  s_13.m_size = (long)local_78.vch.
                      super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)s_13.m_data;
  HexStr_abi_cxx11_(&local_58,s_13);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[19]>
            (&local_b8,&local_368,0x99,1,2,psVar2,"HexStr(ss)","fefefefefefefefe7f",
             "\"fefefefefefefefe7f\"");
  std::__cxx11::string::~string((string *)&local_58);
  if (local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_78.m_read_pos = 0;
  local_58._M_dataplus._M_p = (pointer)0xffffffffffffffff;
  local_b8.m_object = (unsigned_long_long *)&local_58;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_long_long_&>::Serialize<DataStream>
            (&local_b8,&local_78);
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x9a;
  file_14.m_begin = (iterator)&local_378;
  msg_14.m_end = (iterator)psVar2;
  msg_14.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_388,
             msg_14);
  local_b0 = 0;
  local_b8.m_object = (unsigned_long_long *)&PTR__lazy_ostream_011480b0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = "";
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_390 = "";
  s_14.m_data = local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_start + local_78.m_read_pos;
  s_14.m_size = (long)local_78.vch.
                      super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)s_14.m_data;
  HexStr_abi_cxx11_(&local_58,s_14);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[21]>
            (&local_b8,&local_398,0x9a,1,2,&local_58,"HexStr(ss)","80fefefefefefefefe7f",
             "\"80fefefefefefefefe7f\"");
  std::__cxx11::string::~string((string *)&local_58);
  if (local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_78.m_read_pos = 0;
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(varints_bitpatterns)
{
    DataStream ss{};
    ss << VARINT_MODE(0, VarIntMode::NONNEGATIVE_SIGNED); BOOST_CHECK_EQUAL(HexStr(ss), "00"); ss.clear();
    ss << VARINT_MODE(0x7f, VarIntMode::NONNEGATIVE_SIGNED); BOOST_CHECK_EQUAL(HexStr(ss), "7f"); ss.clear();
    ss << VARINT_MODE(int8_t{0x7f}, VarIntMode::NONNEGATIVE_SIGNED); BOOST_CHECK_EQUAL(HexStr(ss), "7f"); ss.clear();
    ss << VARINT_MODE(0x80, VarIntMode::NONNEGATIVE_SIGNED); BOOST_CHECK_EQUAL(HexStr(ss), "8000"); ss.clear();
    ss << VARINT(uint8_t{0x80}); BOOST_CHECK_EQUAL(HexStr(ss), "8000"); ss.clear();
    ss << VARINT_MODE(0x1234, VarIntMode::NONNEGATIVE_SIGNED); BOOST_CHECK_EQUAL(HexStr(ss), "a334"); ss.clear();
    ss << VARINT_MODE(int16_t{0x1234}, VarIntMode::NONNEGATIVE_SIGNED); BOOST_CHECK_EQUAL(HexStr(ss), "a334"); ss.clear();
    ss << VARINT_MODE(0xffff, VarIntMode::NONNEGATIVE_SIGNED); BOOST_CHECK_EQUAL(HexStr(ss), "82fe7f"); ss.clear();
    ss << VARINT(uint16_t{0xffff}); BOOST_CHECK_EQUAL(HexStr(ss), "82fe7f"); ss.clear();
    ss << VARINT_MODE(0x123456, VarIntMode::NONNEGATIVE_SIGNED); BOOST_CHECK_EQUAL(HexStr(ss), "c7e756"); ss.clear();
    ss << VARINT_MODE(int32_t{0x123456}, VarIntMode::NONNEGATIVE_SIGNED); BOOST_CHECK_EQUAL(HexStr(ss), "c7e756"); ss.clear();
    ss << VARINT(0x80123456U); BOOST_CHECK_EQUAL(HexStr(ss), "86ffc7e756"); ss.clear();
    ss << VARINT(uint32_t{0x80123456U}); BOOST_CHECK_EQUAL(HexStr(ss), "86ffc7e756"); ss.clear();
    ss << VARINT(0xffffffff); BOOST_CHECK_EQUAL(HexStr(ss), "8efefefe7f"); ss.clear();
    ss << VARINT_MODE(0x7fffffffffffffffLL, VarIntMode::NONNEGATIVE_SIGNED); BOOST_CHECK_EQUAL(HexStr(ss), "fefefefefefefefe7f"); ss.clear();
    ss << VARINT(0xffffffffffffffffULL); BOOST_CHECK_EQUAL(HexStr(ss), "80fefefefefefefefe7f"); ss.clear();
}